

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O1

void __thiscall TestRegistry::listTestGroupAndCaseNames(TestRegistry *this,TestResult *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  SimpleString groupAndNameList;
  SimpleString groupAndName;
  SimpleString SStack_68;
  SimpleString local_58;
  TestResult *local_48;
  UtestShell *this_00;
  
  local_48 = result;
  SimpleString::SimpleString(&SStack_68,"");
  this_00 = this->tests_;
  do {
    if (this_00 == (UtestShell *)0x0) {
      SimpleString::replace(&SStack_68,"#","");
      SimpleString::SimpleString(&local_58," ");
      bVar1 = SimpleString::endsWith(&SStack_68,&local_58);
      SimpleString::~SimpleString(&local_58);
      if (bVar1) {
        SimpleString::size(&SStack_68);
        SimpleString::subString(&local_58,(size_t)&SStack_68,0);
        SimpleString::operator=(&SStack_68,&local_58);
        SimpleString::~SimpleString(&local_58);
      }
      pcVar3 = SimpleString::asCharString(&SStack_68);
      (*local_48->_vptr_TestResult[0xe])(local_48,pcVar3);
      SimpleString::~SimpleString(&SStack_68);
      return;
    }
    bVar1 = UtestShell::shouldRun(this_00,this->groupFilters_,this->nameFilters_);
    if (bVar1) {
LAB_00131c56:
      SimpleString::SimpleString(&local_58,"");
      SimpleString::operator+=(&local_58,"#");
      UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffc0);
      SimpleString::operator+=(&local_58,(SimpleString *)&stack0xffffffffffffffc0);
      SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
      SimpleString::operator+=(&local_58,".");
      UtestShell::getName((UtestShell *)&stack0xffffffffffffffc0);
      SimpleString::operator+=(&local_58,(SimpleString *)&stack0xffffffffffffffc0);
      SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
      SimpleString::operator+=(&local_58,"#");
      bVar1 = SimpleString::contains(&SStack_68,&local_58);
      if (!bVar1) {
        SimpleString::operator+=(&SStack_68,&local_58);
        SimpleString::operator+=(&SStack_68," ");
      }
      SimpleString::~SimpleString(&local_58);
    }
    else {
      (*local_48->_vptr_TestResult[0xb])();
      if (bVar1) goto LAB_00131c56;
    }
    iVar2 = (*this_00->_vptr_UtestShell[3])(this_00);
    this_00 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  } while( true );
}

Assistant:

void TestRegistry::listTestGroupAndCaseNames(TestResult& result)
{
    SimpleString groupAndNameList;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        if (testShouldRun(test, result)) {
            SimpleString groupAndName;
            groupAndName += "#";
            groupAndName += test->getGroup();
            groupAndName += ".";
            groupAndName += test->getName();
            groupAndName += "#";

            if (!groupAndNameList.contains(groupAndName)) {
                groupAndNameList += groupAndName;
                groupAndNameList += " ";
            }
        }
    }

    groupAndNameList.replace("#", "");

    if (groupAndNameList.endsWith(" "))
        groupAndNameList = groupAndNameList.subString(0, groupAndNameList.size() - 1);
    result.print(groupAndNameList.asCharString());
}